

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O0

CType google::protobuf::internal::cpp::
      EffectiveStringCType<google::protobuf::FieldDescriptor,google::protobuf::FieldOptions>
                (FieldDescriptor *field)

{
  CppStringType CVar1;
  FieldDescriptor *field_local;
  
  CVar1 = FieldDescriptor::cpp_string_type(field);
  field_local._4_4_ = (CType)(CVar1 == kCord);
  return field_local._4_4_;
}

Assistant:

typename FieldOpts::CType EffectiveStringCType(const FieldDesc* field) {
  // TODO Replace this function with
  // FieldDescriptor::cpp_string_type;
  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord:
      return FieldOpts::CORD;
    default:
      return FieldOpts::STRING;
  }
}